

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

int read_features_string(vw *all,v_array<example_*> *examples)

{
  size_t sVar1;
  v_array<example_*> *in_RSI;
  substring example;
  size_t num_chars_initial;
  size_t num_chars;
  char *line;
  example *in_stack_00000148;
  vw *in_stack_00000150;
  undefined1 in_stack_00000158 [16];
  size_t *in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  vw *in_stack_ffffffffffffffb8;
  
  sVar1 = read_features(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  if (sVar1 != 0) {
    v_array<example_*>::operator[](in_RSI,0);
    substring_to_example(in_stack_00000150,in_stack_00000148,(substring)in_stack_00000158);
  }
  return (int)sVar1;
}

Assistant:

int read_features_string(vw* all, v_array<example*>& examples)
{
  char* line;
  size_t num_chars;
  size_t num_chars_initial = read_features(all, line, num_chars);
  if (num_chars_initial < 1)
    return (int)num_chars_initial;

  substring example = {line, line + num_chars};
  substring_to_example(all, examples[0], example);

  return (int)num_chars_initial;
}